

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O2

int __thiscall
opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor::operator()
          (PollishCoefficientsFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double __x;
  undefined1 auVar1 [16];
  undefined1 (*pauVar2) [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Matrix<double,_20,_1,_0,_20,_1> monomials;
  Product<Eigen::Matrix<double,_10,_20,_0,_10,_20>,_Eigen::Matrix<double,_20,_1,_0,_20,_1>,_0>
  local_110;
  Matrix<double,_20,_1,_0,_20,_1> local_100;
  
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[0]
       = pow(*(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,
             3.0);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[1]
       = pow((x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[1]
             ,3.0);
  pauVar2 = (undefined1 (*) [16])
            (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  auVar1 = *pauVar2;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xf] = *(double *)(*pauVar2 + 8);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xb] = auVar1._0_8_;
  auVar4._0_8_ = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.
                 m_data.array[0xb] *
                 local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.
                 m_data.array[0xb];
  auVar4._8_8_ = auVar1._8_8_ * auVar1._8_8_;
  auVar3 = vshufpd_avx(auVar1,auVar1,1);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[9]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
         array[0xb] *
         local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
         array[0xf];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[2]
       = auVar4._0_8_ * auVar3._0_8_;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[3]
       = auVar4._8_8_ * auVar3._8_8_;
  __x = *(double *)pauVar2[1];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[4]
       = auVar4._0_8_ * __x;
  auVar3 = vshufpd_avx(auVar4,auVar4,1);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[5]
       = (double)vmovlpd_avx(auVar4);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[6]
       = auVar3._0_8_ * __x;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[8]
       = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
         array[9] * __x;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array[7]
       = (double)vmovhpd_avx(auVar4);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [10] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
         array[0xb] * __x * __x;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xb] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
          array[0xb] * __x;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xc] = (double)vmovlpd_avx(auVar1);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xd] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
          array[0xf] * __x * __x;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0xe] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.
          array[0xf] * __x;
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x10] = pow(__x,3.0);
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x12] = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[2];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x11] = local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data
           .array[0x12] *
           local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data
           .array[0x12];
  local_100.super_PlainObjectBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_>.m_storage.m_data.array
  [0x13] = 1.0;
  local_110.m_lhs = this->_A;
  local_110.m_rhs = &local_100;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,10,20,0,10,20>,Eigen::Matrix<double,20,1,0,20,1>,0>>
            (fvec,&local_110);
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 3 );
    assert( (unsigned int) fvec.size() == 10);

    //create the monomials vector
    Eigen::Matrix<double,20,1> monomials;
    monomials[0] = pow(x[0],3);
    monomials[1] = pow(x[1],3);
    monomials[2] = pow(x[0],2)*x[1];
    monomials[3] = x[0]*pow(x[1],2);
    monomials[4] = pow(x[0],2)*x[2];
    monomials[5] = pow(x[0],2);
    monomials[6] = pow(x[1],2)*x[2];
    monomials[7] = pow(x[1],2);
    monomials[8] = x[0]*x[1]*x[2];
    monomials[9] = x[0]*x[1];
    monomials[10] = x[0]*pow(x[2],2);
    monomials[11] = x[0]*x[2];
    monomials[12] = x[0];
    monomials[13] = x[1]*pow(x[2],2);
    monomials[14] = x[1]*x[2];
    monomials[15] = x[1];
    monomials[16] = pow(x[2],3);
    monomials[17] = pow(x[2],2);
    monomials[18] = x[2];
    monomials[19] = 1.0;

    fvec = _A*monomials;

    return 0;
  }